

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_step.c
# Opt level: O3

void PDHG_dualGradientStep
               (CUPDLPwork *work,CUPDLPvec *yUpdate,CUPDLPvec *y,CUPDLPvec *Ax,CUPDLPvec *AxUpdate,
               cupdlp_float dDualStepSize)

{
  CUPDLPproblem *pCVar1;
  cupdlp_float alpha;
  cupdlp_float local_38;
  
  pCVar1 = work->problem;
  memcpy(yUpdate->data,y->data,(long)pCVar1->nRows << 3);
  local_38 = dDualStepSize;
  cupdlp_axpy(work,pCVar1->nRows,&local_38,pCVar1->rhs,yUpdate->data);
  local_38 = dDualStepSize * -2.0;
  cupdlp_axpy(work,pCVar1->nRows,&local_38,AxUpdate->data,yUpdate->data);
  local_38 = dDualStepSize;
  cupdlp_axpy(work,pCVar1->nRows,&local_38,Ax->data,yUpdate->data);
  cupdlp_projPos(yUpdate->data + pCVar1->nEqs,pCVar1->nRows - pCVar1->nEqs);
  return;
}

Assistant:

void PDHG_dualGradientStep(CUPDLPwork *work, CUPDLPvec *yUpdate,
                           const CUPDLPvec *y, const CUPDLPvec *Ax,
                           const CUPDLPvec *AxUpdate, cupdlp_float dDualStepSize) {
  CUPDLPproblem *problem = work->problem;

#if !defined(CUPDLP_CPU) && USE_KERNELS
  cupdlp_dgrad_cuda(yUpdate->data, y->data, problem->rhs, Ax->data,
                    AxUpdate->data, dDualStepSize, (int)problem->nRows,
                    (int)problem->nEqs);
#else
  // cupdlp_copy(yUpdate, y, cupdlp_float, problem->nRows);
  CUPDLP_COPY_VEC(yUpdate->data, y->data, cupdlp_float, problem->nRows);

  // AddToVector(yUpdate, dDualStepSize, problem->rhs, problem->nRows);
  // AddToVector(yUpdate, -2.0 * dDualStepSize, AxUpdate, problem->nRows);
  // AddToVector(yUpdate, dDualStepSize, Ax, problem->nRows);

  cupdlp_float alpha = dDualStepSize;
  cupdlp_axpy(work, problem->nRows, &alpha, problem->rhs, yUpdate->data);
  alpha = -2.0 * dDualStepSize;
  cupdlp_axpy(work, problem->nRows, &alpha, AxUpdate->data, yUpdate->data);
  alpha = dDualStepSize;
  cupdlp_axpy(work, problem->nRows, &alpha, Ax->data, yUpdate->data);

  cupdlp_projPos(yUpdate->data + problem->nEqs, problem->nRows - problem->nEqs);
#endif
}